

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeCube>_>::SetIntegrationRule
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeCube>_> *this,int ord)

{
  IntruleType *pIVar1;
  int iVar2;
  IntruleType *pIVar3;
  
  TPZIntelGen<pzshape::TPZShapeCube>::SetIntegrationRule
            ((TPZIntelGen<pzshape::TPZShapeCube> *)this,ord);
  pIVar1 = (IntruleType *)
           (this->super_TPZCompElH1<pzshape::TPZShapeCube>).super_TPZIntelGen<pzshape::TPZShapeCube>
           .super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl.
           fIntegrationRule;
  pIVar3 = &(this->super_TPZCompElH1<pzshape::TPZShapeCube>).
            super_TPZIntelGen<pzshape::TPZShapeCube>.fIntRule;
  if (pIVar1 != (IntruleType *)0x0) {
    pIVar3 = pIVar1;
  }
  iVar2 = (*(pIVar3->super_TPZIntPoints)._vptr_TPZIntPoints[3])();
  if ((this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements ==
      (long)iVar2) {
    return;
  }
  (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapeCube>).
                         super_TPZIntelGen<pzshape::TPZShapeCube>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x178))(this);
  (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapeCube>).
                         super_TPZIntelGen<pzshape::TPZShapeCube>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x168))(this);
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetIntegrationRule(int ord)
{
    TBASE::SetIntegrationRule(ord);
    // verify if the number of integration points changed
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    int intrulepoints = intrule.NPoints();
    if (intrulepoints != fIntPtIndices.size()) {
        SetFreeIntPtIndices();
        PrepareIntPtIndices();
    }
    
}